

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::Parser::Deserialize(Parser *this,Schema *schema)

{
  const_iterator cVar1;
  const_iterator this_00;
  const_iterator this_01;
  bool bVar2;
  int32_t iVar3;
  AdvancedFeatures AVar4;
  String *pSVar5;
  StructDef *pSVar6;
  EnumDef *pEVar7;
  Type *pTVar8;
  Object *pOVar9;
  Object *pOVar10;
  Enum *pEVar11;
  Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *pVVar12;
  Service *pSVar13;
  ServiceDef *this_02;
  Namespace *pNVar14;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *pVVar15;
  SchemaFile *pSVar16;
  mapped_type *this_03;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [8];
  IncludedFile included_file;
  VectorIterator<flatbuffers::Offset<flatbuffers::String>,_const_flatbuffers::String_*,_const_unsigned_char_*,_unsigned_int>
  local_238;
  const_iterator f;
  VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
  local_228;
  const_iterator s;
  ServiceDef *service_def;
  string qualified_name_2;
  VectorIterator<flatbuffers::Offset<reflection::Service>,_const_reflection::Service_*,_const_unsigned_char_*,_unsigned_int>
  local_1f0;
  const_iterator it_4;
  EnumDef *enum_def_1;
  string qualified_name_1;
  VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
  local_1b8;
  const_iterator it_3;
  StructDef *struct_def_1;
  string qualified_name;
  VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
  local_180;
  const_iterator it_2;
  Type *type_1;
  EnumDef *local_130;
  EnumDef *enum_def;
  VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
  local_120;
  const_iterator it_1;
  Type *type;
  string local_e8;
  StructDef *local_c8;
  StructDef *struct_def;
  VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
  local_b8;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  namespaces_index;
  string local_78;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  Schema *local_20;
  Schema *schema_local;
  Parser *this_local;
  
  local_20 = schema;
  schema_local = (Schema *)this;
  pSVar5 = reflection::Schema::file_ident(schema);
  local_42 = 0;
  if (pSVar5 == (String *)0x0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  }
  else {
    pSVar5 = reflection::Schema::file_ident(local_20);
    String::str_abi_cxx11_(&local_40,pSVar5);
  }
  std::__cxx11::string::operator=((string *)&this->file_identifier_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  pSVar5 = reflection::Schema::file_ext(local_20);
  namespaces_index._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  if (pSVar5 == (String *)0x0) {
    std::allocator<char>::allocator();
    namespaces_index._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",
               (allocator<char> *)
               ((long)&namespaces_index._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  else {
    pSVar5 = reflection::Schema::file_ext(local_20);
    String::str_abi_cxx11_(&local_78,pSVar5);
  }
  std::__cxx11::string::operator=((string *)&this->file_extension_,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if ((namespaces_index._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&namespaces_index._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
         *)&it);
  reflection::Schema::objects(local_20);
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::begin
            ((Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)&local_b8);
  while( true ) {
    reflection::Schema::objects(local_20);
    Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::end
              ((Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)&struct_def);
    bVar2 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
            ::operator!=(&local_b8,
                         (VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
                          *)&struct_def);
    if (!bVar2) break;
    pSVar6 = (StructDef *)operator_new(0x148);
    StructDef::StructDef(pSVar6);
    local_c8 = pSVar6;
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator->(&local_b8);
    iVar3 = reflection::Object::bytesize(pOVar9);
    local_c8->bytesize = (long)iVar3;
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator->(&local_b8);
    bVar2 = reflection::Object::is_struct(pOVar9);
    local_c8->fixed = bVar2;
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator->(&local_b8);
    iVar3 = reflection::Object::minalign(pOVar9);
    local_c8->minalign = (long)iVar3;
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator->(&local_b8);
    pSVar5 = reflection::Object::name(pOVar9);
    String::str_abi_cxx11_(&local_e8,pSVar5);
    bVar2 = SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,&local_e8,local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    pSVar6 = local_c8;
    if (bVar2) {
      if (local_c8 != (StructDef *)0x0) {
        StructDef::~StructDef(local_c8);
        operator_delete(pSVar6,0x148);
      }
      this_local._7_1_ = 0;
      goto LAB_00137a15;
    }
    pTVar8 = (Type *)operator_new(0x20);
    Type::Type(pTVar8,BASE_TYPE_STRUCT,local_c8,(EnumDef *)0x0,0);
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator->(&local_b8);
    pSVar5 = reflection::Object::name(pOVar9);
    String::str_abi_cxx11_((string *)&it_1,pSVar5);
    bVar2 = SymbolTable<flatbuffers::Type>::Add(&this->types_,(string *)&it_1,pTVar8);
    std::__cxx11::string::~string((string *)&it_1);
    if (bVar2) {
      if (pTVar8 != (Type *)0x0) {
        operator_delete(pTVar8,0x20);
      }
      this_local._7_1_ = 0;
      goto LAB_00137a15;
    }
    VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
    ::operator++(&local_b8);
  }
  reflection::Schema::enums(local_20);
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::begin
            ((Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)&local_120);
  while( true ) {
    reflection::Schema::enums(local_20);
    Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::end
              ((Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)&enum_def);
    bVar2 = VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
            ::operator!=(&local_120,
                         (VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
                          *)&enum_def);
    if (!bVar2) break;
    pEVar7 = (EnumDef *)operator_new(0x138);
    EnumDef::EnumDef(pEVar7);
    local_130 = pEVar7;
    pEVar11 = VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
              ::operator->(&local_120);
    pSVar5 = reflection::Enum::name(pEVar11);
    String::str_abi_cxx11_((string *)&type_1,pSVar5);
    bVar2 = SymbolTable<flatbuffers::EnumDef>::Add(&this->enums_,(string *)&type_1,local_130);
    std::__cxx11::string::~string((string *)&type_1);
    pEVar7 = local_130;
    if (bVar2) {
      if (local_130 != (EnumDef *)0x0) {
        EnumDef::~EnumDef(local_130);
        operator_delete(pEVar7,0x138);
      }
      this_local._7_1_ = 0;
      goto LAB_00137a15;
    }
    pTVar8 = (Type *)operator_new(0x20);
    Type::Type(pTVar8,BASE_TYPE_UNION,(StructDef *)0x0,local_130,0);
    pEVar11 = VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
              ::operator->(&local_120);
    pSVar5 = reflection::Enum::name(pEVar11);
    String::str_abi_cxx11_((string *)&it_2,pSVar5);
    bVar2 = SymbolTable<flatbuffers::Type>::Add(&this->types_,(string *)&it_2,pTVar8);
    std::__cxx11::string::~string((string *)&it_2);
    if (bVar2) {
      if (pTVar8 != (Type *)0x0) {
        operator_delete(pTVar8,0x20);
      }
      this_local._7_1_ = 0;
      goto LAB_00137a15;
    }
    VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
    ::operator++(&local_120);
  }
  reflection::Schema::objects(local_20);
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::begin
            ((Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)&local_180);
  while( true ) {
    reflection::Schema::objects(local_20);
    Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::end
              ((Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)
               (qualified_name.field_2._M_local_buf + 8));
    bVar2 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
            ::operator!=(&local_180,
                         (VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
                          *)((long)&qualified_name.field_2 + 8));
    if (!bVar2) break;
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator->(&local_180);
    pSVar5 = reflection::Object::name(pOVar9);
    String::str_abi_cxx11_((string *)&struct_def_1,pSVar5);
    it_3.data_ = (uchar *)SymbolTable<flatbuffers::StructDef>::Lookup
                                    (&this->structs_,(string *)&struct_def_1);
    pNVar14 = anon_unknown_0::GetNamespace
                        ((string *)&struct_def_1,&this->namespaces_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                          *)&it);
    this_01.data_ = it_3.data_;
    *(Namespace **)(it_3.data_ + 0xa8) = pNVar14;
    pOVar9 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
             ::operator*(&local_180);
    bVar2 = StructDef::Deserialize((StructDef *)this_01.data_,this,pOVar9);
    if (bVar2) {
      pOVar9 = reflection::Schema::root_table(local_20);
      pOVar10 = VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
                ::operator*(&local_180);
      if (pOVar9 == pOVar10) {
        this->root_struct_def_ = (StructDef *)it_3.data_;
      }
      bVar2 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)&struct_def_1);
    if (bVar2) goto LAB_00137a15;
    VectorIterator<flatbuffers::Offset<reflection::Object>,_const_reflection::Object_*,_const_unsigned_char_*,_unsigned_int>
    ::operator++(&local_180);
  }
  reflection::Schema::enums(local_20);
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::begin
            ((Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)&local_1b8);
  while( true ) {
    reflection::Schema::enums(local_20);
    Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::end
              ((Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *)
               (qualified_name_1.field_2._M_local_buf + 8));
    bVar2 = VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
            ::operator!=(&local_1b8,
                         (VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
                          *)((long)&qualified_name_1.field_2 + 8));
    if (!bVar2) break;
    pEVar11 = VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
              ::operator->(&local_1b8);
    pSVar5 = reflection::Enum::name(pEVar11);
    String::str_abi_cxx11_((string *)&enum_def_1,pSVar5);
    it_4.data_ = (uchar *)SymbolTable<flatbuffers::EnumDef>::Lookup
                                    (&this->enums_,(string *)&enum_def_1);
    pNVar14 = anon_unknown_0::GetNamespace
                        ((string *)&enum_def_1,&this->namespaces_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                          *)&it);
    this_00.data_ = it_4.data_;
    *(Namespace **)(it_4.data_ + 0xa8) = pNVar14;
    pEVar11 = VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
              ::operator*(&local_1b8);
    bVar2 = EnumDef::Deserialize((EnumDef *)this_00.data_,this,pEVar11);
    if (!bVar2) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)&enum_def_1);
    if (!bVar2) goto LAB_00137a15;
    VectorIterator<flatbuffers::Offset<reflection::Enum>,_const_reflection::Enum_*,_const_unsigned_char_*,_unsigned_int>
    ::operator++(&local_1b8);
  }
  pVVar12 = reflection::Schema::services(local_20);
  if (pVVar12 != (Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *)0x0) {
    reflection::Schema::services(local_20);
    Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>::begin
              ((Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *)&local_1f0);
    while( true ) {
      reflection::Schema::services(local_20);
      Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>::end
                ((Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *)
                 (qualified_name_2.field_2._M_local_buf + 8));
      bVar2 = VectorIterator<flatbuffers::Offset<reflection::Service>,_const_reflection::Service_*,_const_unsigned_char_*,_unsigned_int>
              ::operator!=(&local_1f0,
                           (VectorIterator<flatbuffers::Offset<reflection::Service>,_const_reflection::Service_*,_const_unsigned_char_*,_unsigned_int>
                            *)((long)&qualified_name_2.field_2 + 8));
      if (!bVar2) break;
      pSVar13 = VectorIterator<flatbuffers::Offset<reflection::Service>,_const_reflection::Service_*,_const_unsigned_char_*,_unsigned_int>
                ::operator->(&local_1f0);
      pSVar5 = reflection::Service::name(pSVar13);
      String::str_abi_cxx11_((string *)&service_def,pSVar5);
      this_02 = (ServiceDef *)operator_new(0x110);
      memset(this_02,0,0x110);
      ServiceDef::ServiceDef(this_02);
      s.data_ = (uchar *)this_02;
      pNVar14 = anon_unknown_0::GetNamespace
                          ((string *)&service_def,&this->namespaces_,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                            *)&it);
      cVar1.data_ = s.data_;
      *(Namespace **)(s.data_ + 0xa8) = pNVar14;
      pSVar13 = VectorIterator<flatbuffers::Offset<reflection::Service>,_const_reflection::Service_*,_const_unsigned_char_*,_unsigned_int>
                ::operator*(&local_1f0);
      bVar2 = ServiceDef::Deserialize((ServiceDef *)cVar1.data_,this,pSVar13);
      if ((!bVar2) ||
         (bVar2 = SymbolTable<flatbuffers::ServiceDef>::Add
                            (&this->services_,(string *)&service_def,(ServiceDef *)s.data_), bVar2))
      {
        cVar1.data_ = s.data_;
        if (s.data_ != (uchar *)0x0) {
          ServiceDef::~ServiceDef((ServiceDef *)s.data_);
          operator_delete(cVar1.data_,0x110);
        }
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&service_def);
      if (bVar2) goto LAB_00137a15;
      VectorIterator<flatbuffers::Offset<reflection::Service>,_const_reflection::Service_*,_const_unsigned_char_*,_unsigned_int>
      ::operator++(&local_1f0);
    }
  }
  AVar4 = reflection::Schema::advanced_features(local_20);
  this->advanced_features_ = (ulong)AVar4;
  pVVar15 = reflection::Schema::fbs_files(local_20);
  if (pVVar15 != (Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *)0x0) {
    reflection::Schema::fbs_files(local_20);
    Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::begin
              ((Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *)&local_228);
    while( true ) {
      reflection::Schema::fbs_files(local_20);
      Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>::end
                ((Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *)&f);
      bVar2 = VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
              ::operator!=(&local_228,
                           (VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
                            *)&f);
      if (!bVar2) break;
      pSVar16 = VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
                ::operator->(&local_228);
      reflection::SchemaFile::included_filenames(pSVar16);
      Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::begin
                ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)&local_238);
      while( true ) {
        pSVar16 = VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
                  ::operator->(&local_228);
        reflection::SchemaFile::included_filenames(pSVar16);
        Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>::end
                  ((Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                   (included_file.filename.field_2._M_local_buf + 8));
        bVar2 = VectorIterator<flatbuffers::Offset<flatbuffers::String>,_const_flatbuffers::String_*,_const_unsigned_char_*,_unsigned_int>
                ::operator!=(&local_238,
                             (VectorIterator<flatbuffers::Offset<flatbuffers::String>,_const_flatbuffers::String_*,_const_unsigned_char_*,_unsigned_int>
                              *)((long)&included_file.filename.field_2 + 8));
        if (!bVar2) break;
        IncludedFile::IncludedFile((IncludedFile *)local_280);
        pSVar5 = VectorIterator<flatbuffers::Offset<flatbuffers::String>,_const_flatbuffers::String_*,_const_unsigned_char_*,_unsigned_int>
                 ::operator->(&local_238);
        String::str_abi_cxx11_(&local_2a0,pSVar5);
        std::__cxx11::string::operator=
                  ((string *)(included_file.schema_name.field_2._M_local_buf + 8),
                   (string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        pSVar16 = VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
                  ::operator->(&local_228);
        pSVar5 = reflection::SchemaFile::filename(pSVar16);
        String::str_abi_cxx11_(&local_2c0,pSVar5);
        this_03 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                  ::operator[](&this->files_included_per_file_,&local_2c0);
        std::
        set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
        ::insert(this_03,(value_type *)local_280);
        std::__cxx11::string::~string((string *)&local_2c0);
        IncludedFile::~IncludedFile((IncludedFile *)local_280);
        VectorIterator<flatbuffers::Offset<flatbuffers::String>,_const_flatbuffers::String_*,_const_unsigned_char_*,_unsigned_int>
        ::operator++(&local_238);
      }
      VectorIterator<flatbuffers::Offset<reflection::SchemaFile>,_const_reflection::SchemaFile_*,_const_unsigned_char_*,_unsigned_int>
      ::operator++(&local_228);
    }
  }
  this_local._7_1_ = 1;
LAB_00137a15:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
          *)&it);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::Deserialize(const reflection::Schema *schema) {
  file_identifier_ = schema->file_ident() ? schema->file_ident()->str() : "";
  file_extension_ = schema->file_ext() ? schema->file_ext()->str() : "";
  std::map<std::string, Namespace *> namespaces_index;

  // Create defs without deserializing so references from fields to structs and
  // enums can be resolved.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    auto struct_def = new StructDef();
    struct_def->bytesize = it->bytesize();
    struct_def->fixed = it->is_struct();
    struct_def->minalign = it->minalign();
    if (structs_.Add(it->name()->str(), struct_def)) {
      delete struct_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_STRUCT, struct_def, nullptr);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    auto enum_def = new EnumDef();
    if (enums_.Add(it->name()->str(), enum_def)) {
      delete enum_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_UNION, nullptr, enum_def);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }

  // Now fields can refer to structs and enums by index.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    std::string qualified_name = it->name()->str();
    auto struct_def = structs_.Lookup(qualified_name);
    struct_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!struct_def->Deserialize(*this, *it)) { return false; }
    if (schema->root_table() == *it) { root_struct_def_ = struct_def; }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    std::string qualified_name = it->name()->str();
    auto enum_def = enums_.Lookup(qualified_name);
    enum_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!enum_def->Deserialize(*this, *it)) { return false; }
  }

  if (schema->services()) {
    for (auto it = schema->services()->begin(); it != schema->services()->end();
         ++it) {
      std::string qualified_name = it->name()->str();
      auto service_def = new ServiceDef();
      service_def->defined_namespace =
          GetNamespace(qualified_name, namespaces_, namespaces_index);
      if (!service_def->Deserialize(*this, *it) ||
          services_.Add(qualified_name, service_def)) {
        delete service_def;
        return false;
      }
    }
  }
  advanced_features_ = schema->advanced_features();

  if (schema->fbs_files())
    for (auto s = schema->fbs_files()->begin(); s != schema->fbs_files()->end();
         ++s) {
      for (auto f = s->included_filenames()->begin();
           f != s->included_filenames()->end(); ++f) {
        IncludedFile included_file;
        included_file.filename = f->str();
        files_included_per_file_[s->filename()->str()].insert(included_file);
      }
    }

  return true;
}